

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

int vs_u(bitstream *str,uint32_t *val,int size)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int bit;
  uint local_2c;
  
  if (str->dir == VS_DECODE) {
    *val = 0;
  }
  if (0 < size) {
    uVar2 = size - 1;
    do {
      local_2c = (uint)((*val >> (uVar2 & 0x1f) & 1) != 0);
      iVar1 = vs_bit(str,&local_2c);
      if (iVar1 != 0) {
        return 1;
      }
      *val = *val | local_2c << ((byte)uVar2 & 0x1f);
      if (str->type == VS_H263) {
        if (0xf < str->zero_bits) goto LAB_00102ded;
      }
      else if ((str->type == VS_H261) && (0xe < str->zero_bits)) {
LAB_00102ded:
        vs_u_cold_1();
        return 1;
      }
      bVar3 = uVar2 != 0;
      uVar2 = uVar2 - 1;
    } while (bVar3);
  }
  return 0;
}

Assistant:

int vs_u(struct bitstream *str, uint32_t *val, int size) {
	int i;
	int bit;
	if (str->dir == VS_DECODE)
		*val = 0;
	for (i = 0; i < size; i++) {
		bit = *val >> (size - 1 - i) & 1;
		if (vs_bit(str, &bit)) return 1;
		*val |= bit << (size - 1 - i);
		switch (str->type) {
			case VS_H261:
				if (str->zero_bits >= 15) {
					fprintf(stderr, "Too many zero bits in a row\n");
					return 1;
				}
				break;
			case VS_H263:
				if (str->zero_bits >= 16) {
					fprintf(stderr, "Too many zero bits in a row\n");
					return 1;
				}
				break;
			default:
				break;
		}
	}
	return 0;
}